

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O1

void __thiscall asmjit::v1_14::JitAllocator::reset(JitAllocator *this,ResetPolicy resetPolicy)

{
  JitAllocatorPrivateImpl *impl;
  ulong uVar1;
  JitAllocatorPool *pJVar2;
  JitAllocatorBlock *pJVar3;
  JitAllocatorPool *pJVar4;
  void *pvVar5;
  long lVar6;
  JitAllocatorBlock *impl_00;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined4 in_register_00000034;
  JitAllocatorBlock *block;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  void *mem;
  size_t byteSize;
  ulong *puVar15;
  ulong uVar16;
  bool bVar17;
  JitAllocatorBlock *local_88;
  long local_70;
  
  block = (JitAllocatorBlock *)CONCAT44(in_register_00000034,resetPolicy);
  impl = (JitAllocatorPrivateImpl *)this->_impl;
  if (impl != (JitAllocatorPrivateImpl *)JitAllocatorImpl_none) {
    *(undefined8 *)&impl->tree = 0;
    uVar1 = impl->poolCount;
    if (uVar1 != 0) {
      uVar16 = 0;
LAB_00120d66:
      pJVar2 = impl->pools;
      pJVar3 = *(JitAllocatorBlock **)(pJVar2 + uVar16);
      *(undefined8 *)&pJVar2[uVar16].field_0xc = 0;
      *(undefined8 *)(&pJVar2[uVar16].field_0xc + 8) = 0;
      *(undefined8 *)(pJVar2 + uVar16) = 0;
      *(undefined8 *)&pJVar2[uVar16].field_0x8 = 0;
      pJVar2[uVar16].totalAreaSize[0] = 0;
      pJVar2[uVar16].totalAreaSize[1] = 0;
      pJVar2[uVar16].totalAreaUsed[0] = 0;
      pJVar2[uVar16].totalAreaUsed[1] = 0;
      pJVar2[uVar16].totalOverheadBytes = 0;
      if (pJVar3 != (JitAllocatorBlock *)0x0) {
        if ((resetPolicy == kHard) || (((impl->super_Impl).options & kImmediateRelease) != kNone)) {
          local_88 = (JitAllocatorBlock *)0x0;
          impl_00 = pJVar3;
        }
        else {
          impl_00 = *(JitAllocatorBlock **)&pJVar3->field_0x18;
          local_88 = pJVar3;
        }
        while (impl_00 != (JitAllocatorBlock *)0x0) {
          pJVar3 = *(JitAllocatorBlock **)&impl_00->field_0x18;
          JitAllocatorImpl_deleteBlock((JitAllocatorPrivateImpl *)impl_00,block);
          impl_00 = pJVar3;
        }
        if (local_88 == (JitAllocatorBlock *)0x0) goto LAB_001210a3;
        *(undefined8 *)&local_88->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock> = 0;
        *(undefined8 *)&local_88->field_0x18 = 0;
        if ((local_88->_flags & 2) == 0) {
          if (((impl->super_Impl).options & kFillUnusedMemory) != kNone) {
            pJVar4 = local_88->_pool;
            VirtMem::protectJitMemory(kReadWrite);
            puVar15 = local_88->_usedBitVector;
            uVar13 = (ulong)local_88->_areaSize + 0x3f & 0x1ffffffc0;
            if (uVar13 == 0) {
              uVar10 = 0;
            }
            else {
              uVar10 = ~*puVar15;
            }
            uVar7 = (ulong)pJVar4->granularity;
            pvVar5 = (local_88->_mapping).rw;
            uVar9 = 0;
            uVar12 = uVar16;
LAB_00120e67:
            bVar17 = uVar10 != 0;
            uVar11 = uVar10;
            if (uVar10 == 0) {
              uVar9 = uVar9 + 0x40;
              lVar14 = local_70;
              if (uVar9 < uVar13) {
                do {
                  puVar15 = puVar15 + 1;
                  bVar17 = *puVar15 != 0xffffffffffffffff;
                  if (bVar17) {
                    uVar11 = ~*puVar15;
                    goto LAB_00120e73;
                  }
                  uVar9 = uVar9 + 0x40;
                } while (uVar9 < uVar13);
                uVar10 = 0;
                bVar17 = false;
              }
              else {
                bVar17 = false;
              }
            }
            else {
LAB_00120e73:
              lVar14 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                }
              }
              uVar12 = -1L << ((byte)lVar14 & 0x3f);
              lVar14 = uVar9 + lVar14;
              uVar10 = uVar12 ^ uVar11;
              if (uVar12 == uVar11) {
                uVar11 = uVar9 + 0x40;
                uVar12 = uVar11;
                if (uVar13 < uVar11) {
                  uVar12 = uVar13;
                }
                if ((uVar12 - lVar14 != -1) && (uVar9 = uVar11, uVar11 < uVar13)) {
LAB_00120ec5:
                  puVar15 = puVar15 + 1;
                  uVar10 = *puVar15;
                  if (uVar10 == 0) {
                    uVar9 = uVar11 + 0x40;
                    uVar12 = uVar9;
                    if (uVar13 < uVar9) {
                      uVar12 = uVar13;
                    }
                    if (uVar12 - lVar14 != -1) goto code_r0x00120ef2;
                    uVar10 = 0;
                    uVar9 = uVar11;
                  }
                  else {
                    lVar6 = 0;
                    if (uVar10 != 0) {
                      for (; (uVar10 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                      }
                    }
                    uVar12 = lVar6 + uVar11;
                    if (uVar13 < lVar6 + uVar11) {
                      uVar12 = uVar13;
                    }
                    uVar10 = -1L << ((byte)lVar6 & 0x3f) ^ uVar10;
                    uVar9 = uVar11;
                  }
                }
              }
              else {
                lVar6 = 0;
                if (uVar10 != 0) {
                  for (; (uVar10 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                  }
                }
                uVar12 = lVar6 + uVar9;
                if (uVar13 < lVar6 + uVar9) {
                  uVar12 = uVar13;
                }
                uVar10 = uVar10 ^ -1L << ((byte)lVar6 & 0x3f);
              }
            }
            goto LAB_00120f8c;
          }
          goto LAB_00120ff0;
        }
        goto LAB_00121089;
      }
      goto LAB_001210a3;
    }
  }
  return;
code_r0x00120ef2:
  uVar11 = uVar9;
  if (uVar13 <= uVar9) goto code_r0x00120efe;
  goto LAB_00120ec5;
code_r0x00120efe:
  uVar10 = 0;
LAB_00120f8c:
  if (!bVar17) goto LAB_00120fd8;
  mem = (void *)(lVar14 * uVar7 + (long)pvVar5);
  byteSize = (uVar12 - lVar14) * uVar7;
  JitAllocatorImpl_fillPattern(mem,(impl->super_Impl).fillPattern,byteSize);
  VirtMem::flushInstructionCache(mem,byteSize);
  local_70 = lVar14;
  goto LAB_00120e67;
LAB_00120fd8:
  VirtMem::protectJitMemory(kReadExecute);
LAB_00120ff0:
  uVar13 = (ulong)(local_88->_flags & 1);
  uVar10 = (ulong)((uint)((ulong)local_88->_areaSize + 0x3f >> 3) & 0xfffffff8);
  memset(local_88->_usedBitVector,0,uVar10);
  memset(local_88->_stopBitVector,0,uVar10);
  *local_88->_usedBitVector = *local_88->_usedBitVector & 0xfffffffffffffffe | uVar13;
  *local_88->_stopBitVector = *local_88->_stopBitVector & 0xfffffffffffffffe | uVar13;
  uVar8 = local_88->_flags & 1;
  local_88->_areaUsed = uVar8;
  local_88->_largestUnusedArea = local_88->_areaSize - uVar8;
  local_88->_searchStart = uVar8;
  local_88->_searchEnd = local_88->_areaSize;
  local_88->_flags = local_88->_flags & 0xfffffff9 | 2;
LAB_00121089:
  JitAllocatorImpl_insertBlock(impl,local_88);
  pJVar2[uVar16].emptyBlockCount = '\x01';
  block = local_88;
LAB_001210a3:
  uVar16 = uVar16 + 1;
  if (uVar16 == uVar1) {
    return;
  }
  goto LAB_00120d66;
}

Assistant:

void JitAllocator::reset(ResetPolicy resetPolicy) noexcept {
  if (_impl == &JitAllocatorImpl_none)
    return;

  JitAllocatorPrivateImpl* impl = static_cast<JitAllocatorPrivateImpl*>(_impl);
  impl->tree.reset();
  size_t poolCount = impl->poolCount;

  for (size_t poolId = 0; poolId < poolCount; poolId++) {
    JitAllocatorPool& pool = impl->pools[poolId];
    JitAllocatorBlock* block = pool.blocks.first();

    pool.reset();

    if (block) {
      JitAllocatorBlock* blockToKeep = nullptr;
      if (resetPolicy != ResetPolicy::kHard && uint32_t(impl->options & JitAllocatorOptions::kImmediateRelease) == 0) {
        blockToKeep = block;
        block = block->next();
      }

      while (block) {
        JitAllocatorBlock* next = block->next();
        JitAllocatorImpl_deleteBlock(impl, block);
        block = next;
      }

      if (blockToKeep) {
        blockToKeep->_listNodes[0] = nullptr;
        blockToKeep->_listNodes[1] = nullptr;
        JitAllocatorImpl_wipeOutBlock(impl, blockToKeep);
        JitAllocatorImpl_insertBlock(impl, blockToKeep);
        pool.emptyBlockCount = 1;
      }
    }
  }
}